

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenerImpl.cpp
# Opt level: O2

shared_ptr<SL::WS_LITE::IWSListener_Configuration> __thiscall
SL::WS_LITE::WSListener_Configuration::onPong
          (WSListener_Configuration *this,
          function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
          *handle)

{
  long lVar1;
  long *plVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar4;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> sVar5;
  shared_ptr<SL::WS_LITE::HubContext> local_38;
  
  lVar1 = *(long *)((long)&(handle->super__Function_base)._M_functor + 8);
  plVar4 = *(long **)(lVar1 + 8);
  plVar2 = *(long **)(lVar1 + 0x10);
  while( true ) {
    if (plVar4 == plVar2) {
      std::
      make_shared<SL::WS_LITE::WSListener_Configuration,std::shared_ptr<SL::WS_LITE::HubContext>&>
                (&local_38);
      _Var3._M_pi = local_38.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_38.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_IWSListener_Configuration)._vptr_IWSListener_Configuration =
           (_func_int **)
           local_38.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->Impl_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_pi;
      local_38.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      sVar5.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      sVar5.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &this->super_IWSListener_Configuration;
      return (shared_ptr<SL::WS_LITE::IWSListener_Configuration>)
             sVar5.
             super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*(long *)(*(long *)(*plVar4 + 0x38) + 0x118) != 0) break;
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
    ::operator=((function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
                 *)(*(long *)(*plVar4 + 0x38) + 0x108),in_RDX);
    plVar4 = plVar4 + 2;
  }
  __assert_fail("!t->WebSocketContext_->onPong",
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp"
                ,0xc3,
                "virtual std::shared_ptr<IWSListener_Configuration> SL::WS_LITE::WSListener_Configuration::onPong(const std::function<void (const std::shared_ptr<IWebSocket> &, const unsigned char *, size_t)> &)"
               );
}

Assistant:

std::shared_ptr<IWSListener_Configuration>
    WSListener_Configuration::onPong(const std::function<void(const std::shared_ptr<IWebSocket> &, const unsigned char *, size_t)> &handle)
    {

        for (auto &t : Impl_->ThreadContexts) {
            assert(!t->WebSocketContext_->onPong);
            t->WebSocketContext_->onPong = handle;
        }
        return std::make_shared<WSListener_Configuration>(Impl_);
    }